

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall QWidgetRepaintManager::sync(QWidgetRepaintManager *this)

{
  QDebug QVar1;
  bool bVar2;
  char cVar3;
  QLoggingCategory *pQVar4;
  ulong uVar5;
  QPoint QVar6;
  QPlatformTextureList *widgetTextures;
  QRegion *in_RDX;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QPoint local_90;
  undefined4 uStack_88;
  undefined8 uStack_84;
  undefined4 local_7c;
  char *local_78;
  QDebug local_70;
  QRegion local_68;
  QDebug local_60;
  undefined1 local_58 [16];
  QPoint local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar4->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_78 = pQVar4->name;
    local_90.xp.m_i = 2;
    local_90.yp.m_i = 0;
    uStack_88 = 0;
    uStack_84 = 0;
    local_7c = 0;
    QMessageLogger::info();
    QVar1.stream = local_70.stream;
    QVar7.m_data = (storage_type *)0x7;
    QVar7.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
    if (local_48[0] != (QPoint)0x0) {
      LOCK();
      *(int *)local_48[0] = *(int *)local_48[0] + -1;
      UNLOCK();
      if (*(int *)local_48[0] == 0) {
        QArrayData::deallocate((QArrayData *)local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    *(int *)((QTextStream *)local_70.stream + 0x28) =
         *(int *)((QTextStream *)local_70.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_60,&local_68);
    QVar1.stream = local_60.stream;
    QVar8.m_data = (storage_type *)0x2;
    QVar8.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
    if (local_48[0] != (QPoint)0x0) {
      LOCK();
      *(int *)local_48[0] = *(int *)local_48[0] + -1;
      UNLOCK();
      if (*(int *)local_48[0] == 0) {
        QArrayData::deallocate((QArrayData *)local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    *(int *)((QTextStream *)local_60.stream + 0x28) =
         *(int *)((QTextStream *)local_60.stream + 0x28) + 1;
    ::operator<<((Stream *)(local_58 + 8),(QWidget *)local_58);
    QDebug::~QDebug((QDebug *)(local_58 + 8));
    QDebug::~QDebug((QDebug *)local_58);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug((QDebug *)&local_68);
    QDebug::~QDebug(&local_70);
  }
  if ((in_RSI != (QWidget *)0x0) && ((*(uint *)(*(long *)(*(long *)this + 0x20) + 8) & 0x8000) != 0)
     ) {
    bVar2 = hasPlatformWindow(in_RSI);
    if ((bVar2) && ((in_RSI->data->widget_attributes & 0x8c00) == 0x8800)) {
      cVar3 = QRegion::isEmpty();
      if (cVar3 == '\0') {
        if (*(long *)(this + 0x28) == 0) {
          cVar3 = QRegion::isEmpty();
          if ((cVar3 != '\0') && (*(long *)(this + 0x40) == 0)) {
            uVar5 = QBackingStore::size();
            if ((uVar5 & 0x8000000080000000) == 0) {
              widgetTextures = widgetTexturesFor(*(QWidget **)(*(long *)this + 8),in_RSI);
              if (widgetTextures == (QPlatformTextureList *)0x0) {
                QRegion::QRegion((QRegion *)&local_90,in_RDX);
                widgetTextures = (QPlatformTextureList *)0x0;
              }
              else {
                QRegion::QRegion((QRegion *)&local_90);
              }
              flush(this,in_RSI,(QRegion *)&local_90,widgetTextures);
              QRegion::~QRegion((QRegion *)&local_90);
              goto LAB_0031a72d;
            }
          }
        }
        if (*(QWidget **)this == in_RSI) {
          local_90.xp.m_i = 0;
          local_90.yp.m_i = 0;
        }
        else {
          local_48[0].xp.m_i = 0;
          local_48[0].yp.m_i = 0;
          QVar6 = QWidget::mapTo(in_RSI,*(QWidget **)this,local_48);
          local_90.xp = QVar6.xp.m_i;
          local_90.yp = QVar6.yp.m_i;
        }
        markNeedsFlush(this,in_RSI,in_RDX,&local_90);
        bVar2 = syncAllowed(this);
        if (bVar2) {
          paintAndFlush(this);
        }
      }
    }
  }
LAB_0031a72d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::sync(QWidget *exposedWidget, const QRegion &exposedRegion)
{
    qCInfo(lcWidgetPainting) << "Syncing" << exposedRegion << "of" << exposedWidget;

    if (!tlw->isVisible())
        return;

    if (!exposedWidget || !hasPlatformWindow(exposedWidget)
        || !exposedWidget->isVisible() || !exposedWidget->testAttribute(Qt::WA_Mapped)
        || !exposedWidget->updatesEnabled() || exposedRegion.isEmpty()) {
        return;
    }

    // Nothing to repaint.
    if (!isDirty() && store->size().isValid()) {
        QPlatformTextureList *widgetTextures = widgetTexturesFor(tlw, exposedWidget);
        flush(exposedWidget, widgetTextures ? QRegion() : exposedRegion, widgetTextures);
        return;
    }

    // As requests to sync a specific widget typically comes from an expose event
    // we can't rely solely on our own dirty tracking to decide what to flush, and
    // need to respect the platform's request to at least flush the entire widget,
    QPoint offset = exposedWidget != tlw ? exposedWidget->mapTo(tlw, QPoint()) : QPoint();
    markNeedsFlush(exposedWidget, exposedRegion, offset);

    if (syncAllowed())
        paintAndFlush();
}